

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O1

int CheckRudderSSC32(SSC32 *pSSC32)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  timespec local_30;
  
  dVar4 = ABS(pSSC32->MinAngle);
  if (dVar4 <= ABS(pSSC32->MaxAngle)) {
    dVar4 = ABS(pSSC32->MaxAngle);
  }
  iVar2 = (int)(((((pSSC32->MidAngle - pSSC32->MinAngle) * -0.25) / dVar4 + pSSC32->MidAngle) *
                500.0) / dVar4);
  if (499 < iVar2) {
    iVar2 = 500;
  }
  if (iVar2 < -499) {
    iVar2 = -500;
  }
  iVar2 = SetPWMSSC32(pSSC32,pSSC32->rudderchan,iVar2 + 0x5dc);
  iVar3 = 1;
  if (iVar2 == 0) {
    local_30.tv_sec = 2;
    local_30.tv_nsec = 0;
    nanosleep(&local_30,(timespec *)0x0);
    dVar5 = ABS(pSSC32->MaxAngle);
    dVar4 = ABS(pSSC32->MinAngle);
    if (ABS(pSSC32->MinAngle) <= dVar5) {
      dVar4 = dVar5;
    }
    iVar1 = (int)(((((pSSC32->MaxAngle - pSSC32->MidAngle) * 0.25) / dVar4 + pSSC32->MidAngle) *
                  500.0) / dVar4);
    iVar2 = 500;
    if (iVar1 < 500) {
      iVar2 = iVar1;
    }
    iVar1 = -500;
    if (-500 < iVar2) {
      iVar1 = iVar2;
    }
    iVar2 = SetPWMSSC32(pSSC32,pSSC32->rudderchan,iVar1 + 0x5dc);
    if (iVar2 == 0) {
      local_30.tv_sec = 2;
      local_30.tv_nsec = 0;
      nanosleep(&local_30,(timespec *)0x0);
      dVar5 = ABS(pSSC32->MaxAngle);
      dVar4 = ABS(pSSC32->MinAngle);
      if (ABS(pSSC32->MinAngle) <= dVar5) {
        dVar4 = dVar5;
      }
      iVar1 = (int)(((((pSSC32->MaxAngle - pSSC32->MidAngle) * 0.0) / dVar4 + pSSC32->MidAngle) *
                    500.0) / dVar4);
      iVar2 = 500;
      if (iVar1 < 500) {
        iVar2 = iVar1;
      }
      iVar1 = -500;
      if (-500 < iVar2) {
        iVar1 = iVar2;
      }
      iVar2 = SetPWMSSC32(pSSC32,pSSC32->rudderchan,iVar1 + 0x5dc);
      if (iVar2 == 0) {
        local_30.tv_sec = 2;
        local_30.tv_nsec = 0;
        nanosleep(&local_30,(timespec *)0x0);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

inline int CheckRudderSSC32(SSC32* pSSC32)
{
	if (SetRudderSSC32(pSSC32, -0.25) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	mSleep(2000);
	if (SetRudderSSC32(pSSC32, 0.25) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	mSleep(2000);
	if (SetRudderSSC32(pSSC32, 0.0) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	mSleep(2000);

	return EXIT_SUCCESS;
}